

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Array2D<float> * __thiscall
pbrt::Sample2DFunction
          (Array2D<float> *__return_storage_ptr__,pbrt *this,function<float_(float,_float)> *f,
          int nu,int nv,int nSamples,Bounds2f domain,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  allocator_type allocator;
  float *pfVar4;
  int u;
  uint x;
  undefined4 in_register_0000008c;
  size_t i;
  uint64_t a;
  ulong uVar5;
  uint nx;
  uint y;
  undefined1 auVar6 [16];
  Float FVar7;
  Float FVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar11 [64];
  float fVar12;
  undefined8 in_XMM1_Qb;
  undefined1 auVar13 [16];
  double local_b8;
  Tuple2<pbrt::Point2,_float> local_a8;
  uint local_9c;
  float local_98;
  float local_94;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> samples;
  float local_78;
  float local_68;
  float local_58;
  uint local_48;
  undefined1 extraout_var [60];
  
  allocator.memoryResource._4_4_ = in_register_0000008c;
  allocator.memoryResource._0_4_ = nSamples;
  local_68 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  local_78 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
            (&samples,(long)nv,(allocator_type *)&local_a8);
  for (a = 0; (uint)(~(nv >> 0x1f) & nv) != a; a = a + 1) {
    FVar7 = RadicalInverse(0,a);
    FVar8 = RadicalInverse(1,a);
    samples.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start[a].super_Tuple2<pbrt::Point2,_float>.x = FVar7;
    samples.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start[a].super_Tuple2<pbrt::Point2,_float>.y = FVar8;
  }
  local_a8.x = 0.0;
  local_a8.y = 1.0;
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&samples,
             (Point2<float> *)&local_a8);
  local_a8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&samples,
             (Point2<float> *)&local_a8);
  auVar6._8_4_ = 0x3f800000;
  auVar6._0_8_ = 0x3f8000003f800000;
  auVar6._12_4_ = 0x3f800000;
  local_a8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar6);
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&samples,
             (Point2<float> *)&local_a8);
  nx = (uint)f;
  Array2D<float>::Array2D(__return_storage_ptr__,nx,nu,allocator);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_4_ = domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  auVar1._4_4_ = domain.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  auVar1 = vmovshdup_avx(auVar1);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_4_ = domain.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  auVar2._4_4_ = domain.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  auVar2 = vmovshdup_avx(auVar2);
  local_94 = (float)(int)nx;
  local_9c = ~(nu >> 0x1f) & nu;
  local_98 = (float)nu;
  for (y = 0; y != local_9c; y = y + 1) {
    for (x = 0; x != (~((int)nx >> 0x1f) & nx); x = x + 1) {
      uVar5 = 0;
      local_b8 = 0.0;
      while (uVar5 < (ulong)((long)samples.
                                   super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)samples.
                                   super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        fVar9 = ((float)(int)x +
                samples.
                super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar5].super_Tuple2<pbrt::Point2,_float>.x)
                / local_94;
        fVar12 = ((float)(int)y +
                 samples.
                 super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar5].super_Tuple2<pbrt::Point2,_float>.y
                 ) / local_98;
        local_58 = auVar2._0_4_;
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * local_68)),ZEXT416((uint)(1.0 - fVar9)),
                                 ZEXT416((uint)local_78));
        local_48 = auVar1._0_4_;
        auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * local_58)),ZEXT416((uint)(1.0 - fVar12)),
                                 ZEXT416(local_48));
        auVar11._0_4_ =
             std::function<float_(float,_float)>::operator()
                       ((function<float_(float,_float)> *)this,auVar6._0_4_,auVar3._0_4_);
        auVar11._4_60_ = extraout_var;
        auVar3._8_4_ = 0x7fffffff;
        auVar3._0_8_ = 0x7fffffff7fffffff;
        auVar3._12_4_ = 0x7fffffff;
        auVar6 = vandps_avx512vl(auVar11._0_16_,auVar3);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_b8;
        uVar5 = uVar5 + 1;
        auVar10._0_8_ = (double)auVar6._0_4_;
        auVar10._8_8_ = auVar6._8_8_;
        auVar6 = vmaxsd_avx(auVar10,auVar13);
        local_b8 = auVar6._0_8_;
      }
      pfVar4 = Array2D<float>::operator()(__return_storage_ptr__,x,y);
      *pfVar4 = (float)local_b8;
    }
  }
  std::_Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~_Vector_base
            (&samples.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
            );
  return __return_storage_ptr__;
}

Assistant:

Array2D<Float> Sample2DFunction(std::function<Float(Float, Float)> f, int nu, int nv,
                                int nSamples, Bounds2f domain, Allocator alloc) {
    std::vector<Point2f> samples(nSamples);
    for (int i = 0; i < nSamples; ++i)
        samples[i] = Point2f(RadicalInverse(0, i), RadicalInverse(1, i));
    // Check the corners, too.
    samples.push_back(Point2f(0, 1));
    samples.push_back(Point2f(1, 0));
    samples.push_back(Point2f(1, 1));

    Array2D<Float> values(nu, nv, alloc);
    for (int v = 0; v < nv; ++v) {
        for (int u = 0; u < nu; ++u) {
            double accum = 0;
            for (size_t i = 0; i < samples.size(); ++i) {
                Point2f p = domain.Lerp(
                    Point2f((u + samples[i][0]) / nu, (v + samples[i][1]) / nv));
                Float fuv = std::abs(f(p.x, p.y));
                accum = std::max<double>(accum, fuv);
            }
            // There's actually no need for the divide by nSamples, since
            // these are normalzed into a PDF anyway.
            values(u, v) = accum;
        }
    }

    return values;
}